

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O3

int libssh2_agent_list_identities(LIBSSH2_AGENT *agent)

{
  list_node **pplVar1;
  int iVar2;
  uint32_t uVar3;
  list_node *entry;
  list_head *__dest;
  list_node *plVar4;
  char *errmsg;
  LIBSSH2_SESSION *session;
  long lVar5;
  ulong uVar6;
  ulong __n;
  uchar *puVar7;
  ulong uVar8;
  uchar c;
  uchar local_49;
  list_head *local_48;
  list_node *local_40;
  ulong local_38;
  
  *(undefined8 *)&(agent->transctx).state = 0;
  (agent->transctx).send_recv_total = 0;
  (agent->transctx).response = (uchar *)0x0;
  (agent->transctx).response_len = 0;
  (agent->transctx).request = (uchar *)0x0;
  (agent->transctx).request_len = 0;
  agent_free_identities(agent);
  local_49 = '\v';
  if ((agent->transctx).state == agent_NB_state_init) {
    (agent->transctx).request = &local_49;
    (agent->transctx).request_len = 1;
    (agent->transctx).send_recv_total = 0;
    (agent->transctx).state = agent_NB_state_request_created;
  }
  else if (*(agent->transctx).request != '\v') {
    iVar2 = _libssh2_error(agent->session,-0x27,"illegal agent request");
    return iVar2;
  }
  if (agent->ops == (agent_ops *)0x0) {
    session = agent->session;
    errmsg = "agent not connected";
    iVar2 = -0x27;
  }
  else {
    iVar2 = (*agent->ops->transact)(agent,&agent->transctx);
    if (iVar2 != 0) {
      (*agent->session->free)((agent->transctx).response,&agent->session->abstract);
      (agent->transctx).response = (uchar *)0x0;
      return iVar2;
    }
    (agent->transctx).request = (uchar *)0x0;
    uVar6 = (agent->transctx).response_len;
    iVar2 = -0x2a;
    if (((0 < (long)uVar6) && (4 < uVar6)) && (puVar7 = (agent->transctx).response, *puVar7 == '\f')
       ) {
      uVar3 = _libssh2_ntohu32(puVar7 + 1);
      if (uVar3 != 0) {
        uVar8 = (ulong)uVar3;
        puVar7 = puVar7 + 5;
        lVar5 = uVar6 - 5;
        local_48 = &agent->head;
        do {
          if (lVar5 < 4) {
            iVar2 = -0x2a;
            goto LAB_00107ca6;
          }
          entry = (list_node *)(*agent->session->alloc)(0x40,&agent->session->abstract);
          if (entry == (list_node *)0x0) {
            iVar2 = -6;
            goto LAB_00107ca6;
          }
          uVar3 = _libssh2_ntohu32(puVar7);
          plVar4 = (list_node *)(ulong)uVar3;
          entry[2].next = plVar4;
          uVar6 = (lVar5 + -4) - (long)plVar4;
          if ((long)uVar6 < 0) {
            iVar2 = -0x2a;
LAB_00107c9d:
            (*agent->session->free)(entry,&agent->session->abstract);
            goto LAB_00107ca6;
          }
          __dest = (list_head *)(*agent->session->alloc)((size_t)plVar4,&agent->session->abstract);
          entry[1].head = __dest;
          if (__dest == (list_head *)0x0) {
            iVar2 = -6;
            goto LAB_00107c9d;
          }
          puVar7 = puVar7 + 4;
          memcpy(__dest,puVar7,(size_t)entry[2].next);
          iVar2 = -0x2a;
          if (uVar6 < 4) {
LAB_00107c93:
            (*agent->session->free)(entry[1].head,&agent->session->abstract);
            goto LAB_00107c9d;
          }
          local_40 = entry[2].next;
          local_38 = uVar8;
          uVar3 = _libssh2_ntohu32(puVar7 + (long)local_40);
          __n = (ulong)uVar3;
          lVar5 = (uVar6 - 4) - __n;
          if (uVar6 - 4 < __n) goto LAB_00107c93;
          plVar4 = (list_node *)(*agent->session->alloc)(__n + 1,&agent->session->abstract);
          entry[2].prev = plVar4;
          if (plVar4 == (list_node *)0x0) {
            iVar2 = -6;
            goto LAB_00107c93;
          }
          uVar8 = local_38 - 1;
          pplVar1 = &local_40->next;
          *(undefined1 *)((long)&plVar4->next + __n) = 0;
          memcpy(entry[2].prev,puVar7 + (long)((long)pplVar1 + 4),__n);
          puVar7 = puVar7 + (long)((long)pplVar1 + 4) + __n;
          _libssh2_list_add(local_48,entry);
        } while (uVar8 != 0);
      }
      iVar2 = 0;
    }
LAB_00107ca6:
    (*agent->session->free)((agent->transctx).response,&agent->session->abstract);
    (agent->transctx).response = (uchar *)0x0;
    session = agent->session;
    errmsg = "agent list id failed";
  }
  iVar2 = _libssh2_error(session,iVar2,errmsg);
  return iVar2;
}

Assistant:

static int
agent_list_identities(LIBSSH2_AGENT *agent)
{
    agent_transaction_ctx_t transctx = &agent->transctx;
    ssize_t len, num_identities;
    unsigned char *s;
    int rc;
    unsigned char c = SSH2_AGENTC_REQUEST_IDENTITIES;

    /* Create a request to list identities */
    if(transctx->state == agent_NB_state_init) {
        transctx->request = &c;
        transctx->request_len = 1;
        transctx->send_recv_total = 0;
        transctx->state = agent_NB_state_request_created;
    }

    /* Make sure to be re-called as a result of EAGAIN. */
    if(*transctx->request != SSH2_AGENTC_REQUEST_IDENTITIES)
        return _libssh2_error(agent->session, LIBSSH2_ERROR_BAD_USE,
                              "illegal agent request");

    if(!agent->ops)
        /* if no agent has been connected, bail out */
        return _libssh2_error(agent->session, LIBSSH2_ERROR_BAD_USE,
                              "agent not connected");

    rc = agent->ops->transact(agent, transctx);
    if(rc) {
        LIBSSH2_FREE(agent->session, transctx->response);
        transctx->response = NULL;
        return rc;
    }
    transctx->request = NULL;

    len = transctx->response_len;
    s = transctx->response;
    len--;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    if(*s != SSH2_AGENT_IDENTITIES_ANSWER) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    s++;

    /* Read the length of identities */
    len -= 4;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    num_identities = _libssh2_ntohu32(s);
    s += 4;

    while(num_identities--) {
        struct agent_publickey *identity;
        size_t comment_len;

        /* Read the length of the blob */
        len -= 4;
        if(len < 0) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            goto error;
        }
        identity = LIBSSH2_ALLOC(agent->session, sizeof(*identity));
        if(!identity) {
            rc = LIBSSH2_ERROR_ALLOC;
            goto error;
        }
        identity->external.blob_len = _libssh2_ntohu32(s);
        s += 4;

        /* Read the blob */
        len -= identity->external.blob_len;
        if(len < 0) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }

        identity->external.blob = LIBSSH2_ALLOC(agent->session,
                                                identity->external.blob_len);
        if(!identity->external.blob) {
            rc = LIBSSH2_ERROR_ALLOC;
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        memcpy(identity->external.blob, s, identity->external.blob_len);
        s += identity->external.blob_len;

        /* Read the length of the comment */
        len -= 4;
        if(len < 0) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            LIBSSH2_FREE(agent->session, identity->external.blob);
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        comment_len = _libssh2_ntohu32(s);
        s += 4;

        if(comment_len > (size_t)len) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            LIBSSH2_FREE(agent->session, identity->external.blob);
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        /* Read the comment */
        len -= comment_len;

        identity->external.comment = LIBSSH2_ALLOC(agent->session,
                                                   comment_len + 1);
        if(!identity->external.comment) {
            rc = LIBSSH2_ERROR_ALLOC;
            LIBSSH2_FREE(agent->session, identity->external.blob);
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        identity->external.comment[comment_len] = '\0';
        memcpy(identity->external.comment, s, comment_len);
        s += comment_len;

        _libssh2_list_add(&agent->head, &identity->node);
    }
error:
    LIBSSH2_FREE(agent->session, transctx->response);
    transctx->response = NULL;

    return _libssh2_error(agent->session, rc,
                          "agent list id failed");
}